

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

double __thiscall chrono::utils::MixtureIngredient::getDensity(MixtureIngredient *this)

{
  double dVar1;
  
  if (this->m_densityDist != (normal_distribution<double> *)0x0) {
    dVar1 = sampleTruncatedDist<double>(this->m_densityDist,this->m_minDensity,this->m_maxDensity);
    return dVar1;
  }
  return this->m_defDensity;
}

Assistant:

double MixtureIngredient::getDensity() {
    if (m_densityDist)
        return sampleTruncatedDist<double>(*m_densityDist, m_minDensity, m_maxDensity);

    return m_defDensity;
}